

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

void __thiscall llvm::cl::Option::addArgument(Option *this)

{
  CommandLineParser *this_00;
  Option *this_local;
  
  this_00 = ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
            ::operator->(&GlobalParser);
  anon_unknown.dwarf_6c37a::CommandLineParser::addOption(this_00,this);
  this->FullyInitialized = true;
  return;
}

Assistant:

void Option::addArgument() {
  GlobalParser->addOption(this);
  FullyInitialized = true;
}